

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_doc_comment.cc
# Opt level: O0

void google::protobuf::compiler::java::WriteEnumDocComment(Printer *printer,EnumDescriptor *enum_)

{
  string *input;
  string local_38;
  EnumDescriptor *local_18;
  EnumDescriptor *enum__local;
  Printer *printer_local;
  
  local_18 = enum_;
  enum__local = (EnumDescriptor *)printer;
  input = EnumDescriptor::full_name_abi_cxx11_(enum_);
  EscapeJavadoc(&local_38,input);
  io::Printer::Print(printer,"/**\n * Protobuf enum {@code $fullname$}\n","fullname",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  WriteDocCommentBody<google::protobuf::EnumDescriptor>((Printer *)enum__local,local_18);
  io::Printer::Print((Printer *)enum__local," */\n");
  return;
}

Assistant:

void WriteEnumDocComment(io::Printer* printer, const EnumDescriptor* enum_) {
  printer->Print(
    "/**\n"
    " * Protobuf enum {@code $fullname$}\n",
    "fullname", EscapeJavadoc(enum_->full_name()));
  WriteDocCommentBody(printer, enum_);
  printer->Print(" */\n");
}